

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlNodePtr xmlXPathNextChild(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlElementType xVar1;
  xmlNodePtr pxVar2;
  _xmlNode **pp_Var3;
  
  if ((ctxt == (xmlXPathParserContextPtr)0x0) || (ctxt->context == (xmlXPathContextPtr)0x0)) {
    return (xmlNodePtr)0x0;
  }
  if (cur == (xmlNodePtr)0x0) {
    pxVar2 = ctxt->context->node;
    if (pxVar2 == (xmlNodePtr)0x0) {
      return (xmlNodePtr)0x0;
    }
    xVar1 = pxVar2->type;
    if (XML_DTD_NODE < xVar1) {
      return (xmlNodePtr)0x0;
    }
    if (((0x51faU >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) &&
       ((0x2e00U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)) {
      return (xmlNodePtr)0x0;
    }
    pp_Var3 = &pxVar2->children;
  }
  else {
    if ((cur->type | XML_CDATA_SECTION_NODE) == XML_HTML_DOCUMENT_NODE) {
      return (xmlNodePtr)0x0;
    }
    pp_Var3 = &cur->next;
  }
  return *pp_Var3;
}

Assistant:

xmlNodePtr
xmlXPathNextChild(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if (cur == NULL) {
	if (ctxt->context->node == NULL) return(NULL);
	switch (ctxt->context->node->type) {
            case XML_ELEMENT_NODE:
            case XML_TEXT_NODE:
            case XML_CDATA_SECTION_NODE:
            case XML_ENTITY_REF_NODE:
            case XML_ENTITY_NODE:
            case XML_PI_NODE:
            case XML_COMMENT_NODE:
            case XML_NOTATION_NODE:
            case XML_DTD_NODE:
		return(ctxt->context->node->children);
            case XML_DOCUMENT_NODE:
            case XML_DOCUMENT_TYPE_NODE:
            case XML_DOCUMENT_FRAG_NODE:
            case XML_HTML_DOCUMENT_NODE:
		return(((xmlDocPtr) ctxt->context->node)->children);
	    case XML_ELEMENT_DECL:
	    case XML_ATTRIBUTE_DECL:
	    case XML_ENTITY_DECL:
            case XML_ATTRIBUTE_NODE:
	    case XML_NAMESPACE_DECL:
	    case XML_XINCLUDE_START:
	    case XML_XINCLUDE_END:
		return(NULL);
	}
	return(NULL);
    }
    if ((cur->type == XML_DOCUMENT_NODE) ||
        (cur->type == XML_HTML_DOCUMENT_NODE))
	return(NULL);
    return(cur->next);
}